

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

ssize_t __thiscall
anon_unknown.dwarf_3389b47::File::read(File *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 in_register_00000034;
  void *pvVar2;
  void *pvVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->readMutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  pvVar2 = (void *)0x0;
  pvVar3 = pvVar2;
  if (__buf != (void *)0x0) {
    do {
      iVar1 = fgetc((FILE *)this->f);
      pvVar3 = pvVar2;
      if (iVar1 == -1) break;
      *(char *)(CONCAT44(in_register_00000034,__fd) + (long)pvVar2) = (char)iVar1;
      pvVar2 = (void *)((long)pvVar2 + 1);
      pvVar3 = __buf;
    } while (__buf != pvVar2);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return (ssize_t)pvVar3;
}

Assistant:

size_t read(void* buffer, size_t n) override {
    std::unique_lock<std::mutex> lock(readMutex);
    auto out = reinterpret_cast<char*>(buffer);
    for (size_t i = 0; i < n; i++) {
      int c = fgetc(f);
      if (c == EOF) {
        return i;
      }
      out[i] = char(c);
    }
    return n;
  }